

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.cpp
# Opt level: O0

void __thiscall Js::StreamWriter::WriteHostObject(StreamWriter *this,void *data)

{
  ScriptContext *scriptContext_00;
  ThreadContext *pTVar1;
  undefined1 local_60 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  ScriptContext *scriptContext;
  void *data_local;
  StreamWriter *this_local;
  
  scriptContext_00 = ScriptContextHolder::GetScriptContext(&this->super_ScriptContextHolder);
  LeaveScriptObject<true,_true,_false>::LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)
             &autoReentrancyHandler.m_savedReentrancySafeOrHandled,scriptContext_00,&this_local);
  pTVar1 = ScriptContext::GetThreadContext(scriptContext_00);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_60,pTVar1);
  (*this->m_stream->_vptr_HostStream[1])(this->m_stream,data);
  if (scriptContext_00 != (ScriptContext *)0x0) {
    pTVar1 = ScriptContext::GetThreadContext(scriptContext_00);
    ThreadContext::DisposeOnLeaveScript(pTVar1);
  }
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_60);
  LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)
             &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  return;
}

Assistant:

void StreamWriter::WriteHostObject(void* data)
    {
        ScriptContext* scriptContext = GetScriptContext();
        BEGIN_LEAVE_SCRIPT(scriptContext)
        {
            m_stream->WriteHostObject(data);
        }
        END_LEAVE_SCRIPT(scriptContext);
    }